

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

boolean output_pass_setup(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  int iVar2;
  JDIMENSION last_scanline;
  j_decompress_ptr cinfo_local;
  
  if (cinfo->global_state != 0xcc) {
    (*cinfo->master->prepare_for_output_pass)(cinfo);
    cinfo->output_scanline = 0;
    cinfo->global_state = 0xcc;
  }
  do {
    if (cinfo->master->is_dummy_pass == 0) {
      iVar2 = 0xcd;
      if (cinfo->raw_data_out != 0) {
        iVar2 = 0xce;
      }
      cinfo->global_state = iVar2;
      return 1;
    }
    while (cinfo->output_scanline < cinfo->output_height) {
      if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
        cinfo->progress->pass_counter = (ulong)cinfo->output_scanline;
        cinfo->progress->pass_limit = (ulong)cinfo->output_height;
        (*cinfo->progress->progress_monitor)((j_common_ptr)cinfo);
      }
      JVar1 = cinfo->output_scanline;
      (*cinfo->main->process_data)(cinfo,(JSAMPARRAY)0x0,&cinfo->output_scanline,0);
      if (cinfo->output_scanline == JVar1) {
        return 0;
      }
    }
    (*cinfo->master->finish_output_pass)(cinfo);
    (*cinfo->master->prepare_for_output_pass)(cinfo);
    cinfo->output_scanline = 0;
  } while( true );
}

Assistant:

LOCAL(boolean)
output_pass_setup (j_decompress_ptr cinfo)
{
  if (cinfo->global_state != DSTATE_PRESCAN) {
    /* First call: do pass setup */
    (*cinfo->master->prepare_for_output_pass) (cinfo);
    cinfo->output_scanline = 0;
    cinfo->global_state = DSTATE_PRESCAN;
  }
  /* Loop over any required dummy passes */
  while (cinfo->master->is_dummy_pass) {
#ifdef QUANT_2PASS_SUPPORTED
    /* Crank through the dummy pass */
    while (cinfo->output_scanline < cinfo->output_height) {
      JDIMENSION last_scanline;
      /* Call progress monitor hook if present */
      if (cinfo->progress != NULL) {
	cinfo->progress->pass_counter = (long) cinfo->output_scanline;
	cinfo->progress->pass_limit = (long) cinfo->output_height;
	(*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
      }
      /* Process some data */
      last_scanline = cinfo->output_scanline;
      (*cinfo->main->process_data) (cinfo, (JSAMPARRAY) NULL,
				    &cinfo->output_scanline, (JDIMENSION) 0);
      if (cinfo->output_scanline == last_scanline)
	return FALSE;		/* No progress made, must suspend */
    }
    /* Finish up dummy pass, and set up for another one */
    (*cinfo->master->finish_output_pass) (cinfo);
    (*cinfo->master->prepare_for_output_pass) (cinfo);
    cinfo->output_scanline = 0;
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* QUANT_2PASS_SUPPORTED */
  }
  /* Ready for application to drive output pass through
   * jpeg_read_scanlines or jpeg_read_raw_data.
   */
  cinfo->global_state = cinfo->raw_data_out ? DSTATE_RAW_OK : DSTATE_SCANNING;
  return TRUE;
}